

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O2

int If_CutSopBalancePinDelaysIntInt(Vec_Int_t *vCover,int *pTimes,int nSuppAll,char *pPerm)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  word Res;
  word FaninRes [15];
  
  lVar3 = 0;
  uVar4 = 0;
  if (0 < nSuppAll) {
    uVar4 = (ulong)(uint)nSuppAll;
  }
  while( true ) {
    if (uVar4 * 4 - lVar3 == 0) {
      iVar1 = If_CutSopBalancePinDelaysInt(vCover,pTimes,FaninRes,nSuppAll,&Res);
      uVar5 = 0;
      while( true ) {
        if (uVar4 == uVar5) {
          return iVar1;
        }
        uVar2 = If_CutPinDelayGet(Res,(int)uVar5);
        if (uVar2 < 2) break;
        pPerm[uVar5] = (char)uVar2 + -1;
        uVar5 = uVar5 + 1;
      }
      __assert_fail("Delay > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                    ,0xbb,"void If_CutPinDelayTranslate(word, int, char *)");
    }
    if (lVar3 == 0x40) break;
    *(long *)((long)FaninRes + lVar3 * 2) = 1L << ((byte)lVar3 & 0x3f);
    lVar3 = lVar3 + 4;
  }
  __assert_fail("v >= 0 && v < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                ,0x92,"word If_CutPinDelayInit(int)");
}

Assistant:

int If_CutSopBalancePinDelaysIntInt( Vec_Int_t * vCover, int * pTimes, int nSuppAll, char * pPerm )
{
    int i, Delay;
    word Res, FaninRes[IF_MAX_FUNC_LUTSIZE];
    for ( i = 0; i < nSuppAll; i++ )
        FaninRes[i] = If_CutPinDelayInit(i);
    Delay = If_CutSopBalancePinDelaysInt( vCover, pTimes, FaninRes, nSuppAll, &Res );
    If_CutPinDelayTranslate( Res, nSuppAll, pPerm );
    return Delay;
}